

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerSettings.cpp
# Opt level: O2

void __thiscall SWDAnalyzerSettings::LoadSettings(SWDAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mSWDIO);
  SimpleArchive::operator>>(&text_archive,&this->mSWCLK);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWDIO,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWCLK,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void SWDAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mSWDIO;
    text_archive >> mSWCLK;

    ClearChannels();

    AddChannel( mSWDIO, "SWDIO", true );
    AddChannel( mSWCLK, "SWCLK", true );

    UpdateInterfacesFromSettings();
}